

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void gai_scatter_acc_local
               (Integer g_a,void *v,Integer *i,Integer *j,Integer nv,void *alpha,Integer proc)

{
  long lVar1;
  global_array_t *pgVar2;
  void **ppvVar3;
  short sVar4;
  C_Integer *pCVar5;
  bool bVar6;
  Integer IVar7;
  void *scale;
  uint uVar8;
  int iVar9;
  Integer IVar10;
  long lVar11;
  void **__ptr;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  C_Integer CVar16;
  C_Integer CVar17;
  long lVar18;
  void *pvVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  Integer index [2];
  Integer _hi [2];
  Integer ldp;
  char *ptr_ref;
  long local_188;
  void *local_180;
  long local_178;
  void *local_170;
  Integer local_168;
  char *local_160;
  armci_giov_t desc;
  Integer hi [2];
  Integer lo [2];
  
  if (nv < 1) {
    return;
  }
  lVar1 = g_a + 1000;
  local_178 = (long)GA[lVar1].p_handle;
  local_180 = v;
  local_170 = alpha;
  pnga_distribution(g_a,proc,lo,hi);
  if (GA[lVar1].distr_type != 0) {
    pnga_access_block_ptr(g_a,proc,&ptr_ref,&ldp);
    iVar9 = GA[lVar1].distr_type;
    if (iVar9 - 3U < 2) {
      sVar4 = GA[lVar1].ndim;
      uVar8 = (uint)sVar4;
      lVar13 = (long)(int)proc % GA[lVar1].num_blocks[0];
      if (1 < (int)uVar8) {
        lVar15 = 0;
        lVar23 = lVar13;
        do {
          proc = ((int)proc - lVar23) / GA[g_a + 1000].num_blocks[lVar15];
          lVar23 = (long)(int)proc % GA[g_a + 1000].num_blocks[lVar15 + 1];
          index[lVar15 + 1] = lVar23;
          lVar15 = lVar15 + 1;
        } while ((ulong)uVar8 - 1 != lVar15);
      }
      index[0] = lVar13 % (long)GA[lVar1].nblock[0];
      index[1] = index[1] % (long)GA[lVar1].nblock[1];
      if (0 < sVar4) {
        uVar21 = 0;
        do {
          (&desc.src_ptr_array)[uVar21] =
               (void **)(index[uVar21] % (long)GA[g_a + 1000].nblock[uVar21]);
          uVar21 = uVar21 + 1;
        } while (uVar8 != uVar21);
      }
      proc = (Integer)(&local_160)[(int)uVar8];
      if (1 < sVar4) {
        uVar21 = (ulong)(uVar8 - 2);
        do {
          proc = GA[g_a + 1000].nblock[uVar21] * proc + (long)(&desc.src_ptr_array)[uVar21];
          bVar6 = 0 < (long)uVar21;
          uVar21 = uVar21 - 1;
        } while (bVar6);
      }
    }
    else if (iVar9 == 2) {
      sVar4 = GA[lVar1].ndim;
      uVar8 = (uint)sVar4;
      lVar13 = (long)(int)proc % GA[lVar1].num_blocks[0];
      if (1 < (int)uVar8) {
        lVar15 = 0;
        lVar23 = lVar13;
        do {
          proc = ((int)proc - lVar23) / GA[g_a + 1000].num_blocks[lVar15];
          lVar23 = (long)(int)proc % GA[g_a + 1000].num_blocks[lVar15 + 1];
          index[lVar15 + 1] = lVar23;
          lVar15 = lVar15 + 1;
        } while ((ulong)uVar8 - 1 != lVar15);
      }
      index[0] = lVar13 % (long)GA[lVar1].nblock[0];
      index[1] = index[1] % (long)GA[lVar1].nblock[1];
      if (0 < sVar4) {
        uVar21 = 0;
        do {
          (&desc.src_ptr_array)[uVar21] =
               (void **)(index[uVar21] % (long)GA[g_a + 1000].nblock[uVar21]);
          uVar21 = uVar21 + 1;
        } while (uVar8 != uVar21);
      }
      proc = (Integer)(&local_160)[(int)uVar8];
      if (1 < sVar4) {
        uVar21 = (ulong)(uVar8 - 2);
        do {
          proc = GA[g_a + 1000].nblock[uVar21] * proc + (long)(&desc.src_ptr_array)[uVar21];
          bVar6 = 0 < (long)uVar21;
          uVar21 = uVar21 - 1;
        } while (bVar6);
      }
    }
    else if (iVar9 == 1) {
      IVar10 = pnga_nnodes();
      proc = proc % IVar10;
    }
    goto LAB_0016dc7b;
  }
  pgVar2 = GA + lVar1;
  lVar13 = pgVar2->num_rstrctd;
  CVar17 = proc;
  if (0 < lVar13) {
    CVar17 = pgVar2->rank_rstrctd[proc];
  }
  lVar23 = pgVar2->width[0];
  lVar15 = pgVar2->width[1];
  if (lVar13 == 0) {
    lVar22 = (long)pgVar2->ndim;
    if (lVar22 < 1) {
      lVar11 = 1;
    }
    else {
      lVar11 = 1;
      lVar12 = 0;
      do {
        lVar11 = lVar11 * GA[g_a + 1000].nblock[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar22 != lVar12);
    }
    if ((CVar17 < 0) || (lVar11 <= CVar17)) goto LAB_0016db1c;
    if (0 < pgVar2->ndim) {
      pCVar5 = pgVar2->mapc;
      lVar12 = 0;
      lVar18 = 0;
      lVar11 = CVar17;
      do {
        lVar20 = (long)GA[g_a + 1000].nblock[lVar12];
        lVar14 = lVar11 % lVar20;
        index[lVar12] = pCVar5[lVar14 + lVar18];
        if (lVar14 == lVar20 + -1) {
          CVar16 = GA[g_a + 1000].dims[lVar12];
        }
        else {
          CVar16 = pCVar5[lVar14 + lVar18 + 1] + -1;
        }
        lVar18 = lVar18 + lVar20;
        _hi[lVar12] = CVar16;
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 / lVar20;
      } while (lVar22 != lVar12);
    }
  }
  else {
    sVar4 = pgVar2->ndim;
    lVar22 = (long)sVar4;
    if (CVar17 < lVar13) {
      if (sVar4 < 1) {
        lVar11 = 1;
      }
      else {
        lVar11 = 1;
        lVar12 = 0;
        do {
          lVar11 = lVar11 * GA[g_a + 1000].nblock[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar22 != lVar12);
      }
      if ((-1 < CVar17) && (CVar17 < lVar11)) {
        if (0 < sVar4) {
          pCVar5 = pgVar2->mapc;
          lVar12 = 0;
          lVar18 = 0;
          lVar11 = CVar17;
          do {
            lVar20 = (long)GA[g_a + 1000].nblock[lVar18];
            lVar14 = lVar11 % lVar20;
            index[lVar18] = pCVar5[lVar14 + lVar12];
            if (lVar14 == lVar20 + -1) {
              CVar16 = GA[g_a + 1000].dims[lVar18];
            }
            else {
              CVar16 = pCVar5[lVar14 + lVar12 + 1] + -1;
            }
            lVar12 = lVar12 + lVar20;
            _hi[lVar18] = CVar16;
            lVar18 = lVar18 + 1;
            lVar11 = lVar11 / lVar20;
          } while (lVar22 != lVar18);
        }
        goto LAB_0016db4a;
      }
    }
LAB_0016db1c:
    if (0 < (short)lVar22) {
      memset(index,0,lVar22 << 3);
      memset(_hi,0xff,lVar22 << 3);
    }
  }
LAB_0016db4a:
  IVar7 = index[1];
  IVar10 = index[0];
  if (pgVar2->p_handle == 0) {
    CVar16 = (C_Integer)PGRP_LIST->inv_map_proc_list[CVar17];
  }
  else {
    CVar16 = CVar17;
    if (lVar13 != 0) {
      CVar16 = pgVar2->rstrctd_list[CVar17];
    }
  }
  if ((_hi[1] < lo[1] || _hi[0] < lo[0]) || (lo[1] < index[1] || lo[0] < index[0])) {
    sprintf((char *)&desc,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation",
            CVar17,lo[0],lo[1],index[0],_hi[0],index[1],_hi[1]);
    pnga_error((char *)&desc,g_a);
  }
  ldp = ((lVar23 * 2 + 1) - IVar10) + _hi[0];
  ptr_ref = GA[lVar1].ptr[CVar16] +
            (((lVar23 + lo[0]) - IVar10) + ((lVar15 + lo[1]) - IVar7) * ldp) *
            *(long *)(BYTE_ARRAY_001d21c9 + (long)GA[lVar1].type * 0x10 + 0x13f);
LAB_0016dc7b:
  local_188 = (long)GA[lVar1].type;
  lVar1 = *(long *)(BYTE_ARRAY_001d21c9 + local_188 * 0x10 + 0x13f);
  iVar9 = (int)nv;
  local_168 = g_a;
  __ptr = (void **)malloc((long)(iVar9 * 2) << 3);
  if (__ptr == (void **)0x0) {
    pnga_error("malloc failed",nv);
  }
  IVar10 = ldp;
  ppvVar3 = __ptr + nv;
  lVar13 = 1;
  if (1 < nv) {
    lVar13 = nv;
  }
  local_160 = ptr_ref;
  lVar23 = 0;
  pvVar19 = local_180;
  do {
    lVar15 = i[lVar23];
    if ((hi[0] < lVar15 || lVar15 < lo[0]) || (hi[1] < j[lVar23] || j[lVar23] < lo[1])) {
      sprintf((char *)&desc,"proc=%d invalid i/j=(%ld,%ld)>< [%ld:%ld,%ld:%ld]",proc,lVar15,
              j[lVar23],lo[0],hi[0],lo[1],hi[1]);
      pnga_error((char *)&desc,local_168);
    }
    scale = local_170;
    ppvVar3[lVar23] = local_160 + ((i[lVar23] - lo[0]) + (j[lVar23] - lo[1]) * IVar10) * lVar1;
    __ptr[lVar23] = pvVar19;
    lVar23 = lVar23 + 1;
    pvVar19 = (void *)((long)pvVar19 + lVar1);
  } while (lVar13 != lVar23);
  desc.bytes = (int)lVar1;
  if (GA_fence_set != 0) {
    fence_array[proc] = '\x01';
  }
  if (-1 < (int)local_178) {
    proc = (Integer)(uint)PGRP_LIST[local_178].inv_map_proc_list[proc];
  }
  desc.src_ptr_array = __ptr;
  desc.dst_ptr_array = ppvVar3;
  desc.ptr_array_len = iVar9;
  if (local_170 == (void *)0x0) {
    iVar9 = 0;
  }
  else {
    uVar8 = (int)local_188 - 0x3e9;
    if ((uVar8 < 7) && ((0x6fU >> (uVar8 & 0x1f) & 1) != 0)) {
      iVar9 = *(int *)(&DAT_001b93c8 + (ulong)uVar8 * 4);
    }
    else {
      pnga_error("type not supported",local_188);
      iVar9 = -1;
    }
    iVar9 = ARMCI_AccV(iVar9,scale,&desc,1,(int)proc);
  }
  if (iVar9 != 0) {
    pnga_error("scatter/_acc failed in armci",(long)iVar9);
  }
  free(__ptr);
  return;
}

Assistant:

void gai_scatter_acc_local(Integer g_a, void *v,Integer *i,Integer *j,
                          Integer nv, void* alpha, Integer proc) 
{
void **ptr_src, **ptr_dst;
char *ptr_ref;
Integer ldp, item_size, ilo, ihi, jlo, jhi, type;
Integer lo[2], hi[2];
Integer handle,p_handle,iproc;
armci_giov_t desc;
register Integer k, offset;
int rc=0;

  if (nv < 1) return;

  
  handle = GA_OFFSET + g_a;
  p_handle = GA[handle].p_handle;

  pnga_distribution(g_a, proc, lo, hi);
  ilo = lo[0];
  jlo = lo[1];
  ihi = hi[0];
  jhi = hi[1];

  iproc = proc;
  if (GA[handle].distr_type == REGULAR) {
    if (GA[handle].num_rstrctd > 0)
      iproc = GA[handle].rank_rstrctd[iproc];
    gaShmemLocation(iproc, g_a, ilo, jlo, &ptr_ref, &ldp);
  } else {
    /*
    Integer lo[2];
    lo[0] = ilo;
    lo[1] = jlo;
    */
    pnga_access_block_ptr(g_a, iproc, &ptr_ref, &ldp);
    pnga_release_block(g_a, iproc);
    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      proc = proc%pnga_nnodes();
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[2];
      gam_find_block_indices(handle, proc, index);
      index[0] = index[0]%GA[handle].nblock[0];
      index[1] = index[1]%GA[handle].nblock[1];
      gam_find_proc_from_sl_indices(handle,proc,index);
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[2];
      gam_find_block_indices(handle, proc, index);
      index[0] = index[0]%GA[handle].nblock[0];
      index[1] = index[1]%GA[handle].nblock[1];
      gam_find_tile_proc_from_indices(handle,proc,index);
    }

  }

  type = GA[handle].type;
  item_size = GAsizeofM(type);

  ptr_src = malloc((int)nv*2*sizeof(void*));
  if(ptr_src==NULL)pnga_error("malloc failed",nv);
  ptr_dst=ptr_src+ nv;

  for(k=0; k< nv; k++){
     if(i[k] < ilo || i[k] > ihi  || j[k] < jlo || j[k] > jhi){
       char err_string[ERR_STR_LEN];
       sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)>< [%ld:%ld,%ld:%ld]",
               (int)proc, (long)i[k], (long)j[k], (long)ilo, 
               (long)ihi, (long)jlo, (long)jhi); 
       pnga_error(err_string,g_a);
     }

     offset  = (j[k] - jlo)* ldp + i[k] - ilo;
     ptr_dst[k] = ptr_ref + item_size * offset;
     ptr_src[k] = ((char*)v) + k*item_size;
  }
  desc.bytes = (int)item_size;
  desc.src_ptr_array = ptr_src;
  desc.dst_ptr_array = ptr_dst;
  desc.ptr_array_len = (int)nv;

  if(GA_fence_set)fence_array[proc]=1;

  if (p_handle >= 0) {
    proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
  }
  if(alpha != NULL) {
    int optype=-1;
    if(type==C_DBL) optype= ARMCI_ACC_DBL;
    else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
    else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
    else if(type==C_INT)optype= ARMCI_ACC_INT;
    else if(type==C_LONG)optype= ARMCI_ACC_LNG;
    else if(type==C_FLOAT)optype= ARMCI_ACC_FLT;  
    else pnga_error("type not supported",type);
    rc= ARMCI_AccV(optype, alpha, &desc, 1, (int)proc);
  }

  if(rc) pnga_error("scatter/_acc failed in armci",rc);

  free(ptr_src);

}